

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O0

void Pdr_InvPrint(Vec_Int_t *vInv,int fVerbose)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Vec_Int_t *vCounts_00;
  Vec_Str_t *p;
  char *pcVar6;
  Vec_Str_t *vStr;
  Vec_Int_t *vCounts;
  int fVerbose_local;
  Vec_Int_t *vInv_local;
  
  uVar1 = Vec_IntEntry(vInv,0);
  iVar2 = Vec_IntSize(vInv);
  iVar3 = Vec_IntEntry(vInv,0);
  uVar4 = Pdr_InvUsedFlopNum(vInv);
  uVar5 = Vec_IntEntryLast(vInv);
  Abc_Print(1,"Invariant contains %d clauses with %d literals and %d flops (out of %d).\n",
            (ulong)uVar1,(ulong)((iVar2 - iVar3) - 2),(ulong)uVar4,(ulong)uVar5);
  if (fVerbose != 0) {
    vCounts_00 = Pdr_InvCounts(vInv);
    p = Pdr_InvPrintStr(vInv,vCounts_00);
    pcVar6 = Vec_StrArray(p);
    Abc_Print(1,"%s",pcVar6);
    Vec_IntFree(vCounts_00);
    Vec_StrFree(p);
  }
  return;
}

Assistant:

void Pdr_InvPrint( Vec_Int_t * vInv, int fVerbose )
{
    Abc_Print(1, "Invariant contains %d clauses with %d literals and %d flops (out of %d).\n", Vec_IntEntry(vInv, 0), Vec_IntSize(vInv)-Vec_IntEntry(vInv, 0)-2, Pdr_InvUsedFlopNum(vInv), Vec_IntEntryLast(vInv) );
    if ( fVerbose )
    {
        Vec_Int_t * vCounts = Pdr_InvCounts( vInv );
        Vec_Str_t * vStr = Pdr_InvPrintStr( vInv, vCounts );
        Abc_Print(1, "%s", Vec_StrArray( vStr ) );
        Vec_IntFree( vCounts );
        Vec_StrFree( vStr );
    }
}